

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,int>::
IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>> *this)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<ParamIterator<VarintErrorCase>,_ParamIterator<int>_>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<ParamIterator<VarintErrorCase>,_ParamIterator<int>_>_> *p_Var3;
  __tuple_element_t<0UL,_tuple<ParamIterator<VarintErrorCase>,_ParamIterator<int>_>_> *this_00;
  size_t NextI;
  bool last;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  p_Var2 = std::
           get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,testing::internal::ParamIterator<int>>
                     ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,_testing::internal::ParamIterator<int>_>
                       *)(this + 0x30));
  p_Var3 = std::
           get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,testing::internal::ParamIterator<int>>
                     ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,_testing::internal::ParamIterator<int>_>
                       *)(this + 0x20));
  bVar1 = ParamIterator<int>::operator!=(p_Var2,p_Var3);
  if (!bVar1) {
    p_Var2 = std::
             get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,testing::internal::ParamIterator<int>>
                       ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,_testing::internal::ParamIterator<int>_>
                         *)(this + 0x10));
    p_Var3 = std::
             get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,testing::internal::ParamIterator<int>>
                       ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,_testing::internal::ParamIterator<int>_>
                         *)(this + 0x30));
    ParamIterator<int>::operator=(p_Var3,p_Var2);
    this_00 = std::
              get<0ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,testing::internal::ParamIterator<int>>
                        ((tuple<testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>,_testing::internal::ParamIterator<int>_>
                          *)(this + 0x30));
    ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintErrorCase>::operator++(this_00)
    ;
    AdvanceIfEnd<0ul>(this);
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }